

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O1

string * __thiscall json::literal::dump_abi_cxx11_(string *__return_storage_ptr__,literal *this)

{
  literal_value lVar1;
  char *pcVar2;
  char *pcVar3;
  
  lVar1 = this->_lvalue;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (lVar1 == falsevalue) {
    pcVar3 = "false";
    pcVar2 = "";
  }
  else if (lVar1 == nullvalue) {
    pcVar3 = "null";
    pcVar2 = "";
  }
  else {
    pcVar3 = "true";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string json::literal::dump () const
{
       if (_lvalue == nullvalue)  return "null";
  else if (_lvalue == falsevalue) return "false";
  else                            return "true";
}